

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O3

exr_result_t
LossyDctEncoder_execute
          (_func_void_ptr_size_t *alloc_fn,_func_void_void_ptr *free_fn,LossyDctEncoder *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  uint16_t *puVar13;
  undefined4 *puVar14;
  char cVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  bool bVar32;
  bool bVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  int i;
  uint uVar38;
  long lVar39;
  void *pvVar40;
  uint64_t uVar41;
  bool bVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  uint8_t *puVar46;
  ulong uVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  uint uVar51;
  long lVar52;
  int iVar53;
  uint16_t *curAC;
  uint16_t *puVar54;
  long lVar55;
  int x;
  long lVar56;
  int y;
  uint uVar57;
  long lVar58;
  uint uVar59;
  long lVar60;
  __m128 *srcVec;
  ulong uVar61;
  ushort uVar62;
  int iVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  DctCoderChannelData *chanData [3];
  uint16_t halfZigCoef [64];
  long local_168 [3];
  void *local_150;
  long local_148;
  float *local_140;
  uint16_t *local_138;
  _func_void_void_ptr *local_130;
  ulong local_128;
  ulong local_120;
  uint16_t *local_118;
  float *local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  uint16_t *local_e0;
  float *local_d8;
  uint64_t *local_d0;
  long local_c8;
  long local_c0;
  uint16_t local_b8 [68];
  
  iVar63 = e->_width;
  iVar11 = e->_channel_encode_data_count;
  lVar60 = (long)iVar11;
  iVar45 = e->_height;
  local_130 = free_fn;
  fVar64 = ceilf((float)iVar63 * 0.125);
  fVar65 = ceilf((float)iVar45 * 0.125);
  uVar38 = (uint)fVar64;
  uVar48 = (uint)fVar65;
  puVar54 = (uint16_t *)e->_packedAc;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  if (lVar60 < 1) {
    local_150 = (void *)0x0;
  }
  else {
    memcpy(local_168,e->_channel_encode_data,lVar60 * 8);
    iVar49 = 0;
    lVar39 = 0;
    do {
      iVar53 = 0;
      if (e->_channel_encode_data[lVar39]->_type == EXR_PIXEL_FLOAT) {
        iVar53 = iVar45 * iVar63;
      }
      iVar49 = iVar49 + iVar53;
      lVar39 = lVar39 + 1;
    } while (lVar60 != lVar39);
    if (iVar49 == 0) {
      pvVar40 = (void *)0x0;
    }
    else {
      pvVar40 = (*alloc_fn)((long)iVar49 * 2);
      if (pvVar40 == (void *)0x0) {
        return 1;
      }
    }
    local_150 = pvVar40;
    if (0 < iVar11) {
      lVar39 = 0;
      do {
        lVar52 = local_168[lVar39];
        if ((*(int *)(lVar52 + 0x1a0) == 2) && (iVar63 = e->_height, 0 < (long)iVar63)) {
          uVar43 = e->_width;
          lVar55 = 0;
          do {
            lVar58 = *(long *)(lVar52 + 0x188);
            if (0 < (int)uVar43) {
              lVar12 = *(long *)(lVar58 + lVar55 * 8);
              uVar61 = 0;
              do {
                fVar64 = *(float *)(lVar12 + uVar61 * 4);
                fVar65 = 65504.0;
                if ((fVar64 <= 65504.0) && (fVar65 = fVar64, fVar64 < -65504.0)) {
                  fVar65 = -65504.0;
                }
                fVar64 = ABS(fVar65);
                uVar62 = (ushort)((uint)fVar65 >> 0x10) & 0x8000;
                if ((uint)fVar64 < 0x38800000) {
                  if ((0x33000000 < (uint)fVar64) &&
                     (uVar50 = (uint)fVar65 & 0x7fffff | 0x800000,
                     cVar15 = (char)((uint)fVar64 >> 0x17),
                     uVar62 = uVar62 | (ushort)(uVar50 >> (0x7eU - cVar15 & 0x1f)),
                     0x80000000 < uVar50 << (cVar15 + 0xa2U & 0x1f))) {
                    uVar62 = uVar62 + 1;
                  }
                }
                else if ((uint)fVar64 < 0x7f800000) {
                  if ((uint)fVar64 < 0x477ff000) {
                    uVar62 = (ushort)((int)fVar64 + 0x8000fff +
                                      (uint)(((uint)fVar64 >> 0xd & 1) != 0) >> 0xd) | uVar62;
                  }
                  else {
                    uVar62 = uVar62 | 0x7c00;
                  }
                }
                else {
                  uVar62 = uVar62 | 0x7c00;
                  if (fVar64 != INFINITY) {
                    uVar50 = (uint)fVar64 >> 0xd & 0x3ff;
                    uVar62 = uVar62 | (ushort)uVar50 | (ushort)(uVar50 == 0);
                  }
                }
                *(ushort *)((long)pvVar40 + uVar61 * 2) = uVar62;
                uVar61 = uVar61 + 1;
              } while (uVar43 != uVar61);
            }
            *(void **)(lVar58 + lVar55 * 8) = pvVar40;
            pvVar40 = (void *)((long)pvVar40 + (long)(int)uVar43 * 2);
            lVar55 = lVar55 + 1;
          } while (lVar55 != iVar63);
        }
        lVar39 = lVar39 + 1;
      } while (lVar39 != lVar60);
      puVar46 = e->_packedDc;
      local_148 = local_168[0];
      *(uint8_t **)(local_168[0] + 0x180) = puVar46;
      if (iVar11 != 1) {
        puVar46 = puVar46 + (long)(int)(uVar48 * uVar38) * 2;
        lVar39 = 1;
        do {
          *(uint8_t **)(local_168[lVar39] + 0x180) = puVar46;
          lVar39 = lVar39 + 1;
          puVar46 = puVar46 + (long)(int)(uVar48 * uVar38) * 2;
        } while (lVar60 != lVar39);
      }
      goto LAB_0010f4ca;
    }
  }
  local_148 = local_168[0];
  *(uint8_t **)(local_168[0] + 0x180) = e->_packedDc;
LAB_0010f4ca:
  if (0 < (int)uVar48) {
    local_d0 = &e->_numAcComp;
    local_110 = e->_quantTableY;
    local_118 = e->_hquantTableY;
    local_d8 = e->_quantTableCbCr;
    local_e0 = e->_hquantTableCbCr;
    local_128 = (ulong)uVar48;
    local_f8 = (ulong)uVar38;
    uVar61 = 0;
    do {
      local_120 = uVar61;
      if (0 < (int)uVar38) {
        local_100 = local_168[1];
        local_108 = local_168[2];
        local_c0 = uVar61 * 8;
        uVar47 = 0xffffffff;
        iVar63 = 0;
        uVar61 = 0;
        do {
          local_f0 = uVar61;
          local_e8 = uVar47;
          if (0 < iVar11) {
            iVar45 = e->_width;
            iVar49 = e->_height;
            puVar13 = e->_toNonlinear;
            lVar39 = 0;
            do {
              lVar52 = local_168[lVar39];
              lVar55 = *(long *)(lVar52 + 0x188);
              lVar58 = 0;
              do {
                uVar43 = (int)local_c0 + (int)lVar58;
                uVar48 = ~uVar43 + iVar49 * 2;
                if ((int)uVar43 < iVar49) {
                  uVar48 = uVar43;
                }
                if ((int)uVar48 < 0) {
                  uVar48 = iVar49 - 1;
                }
                lVar12 = *(long *)(lVar55 + (long)(int)uVar48 * 8);
                lVar56 = 0;
                iVar53 = (int)uVar47 + iVar45 * 2;
                do {
                  iVar44 = iVar63 + (int)lVar56;
                  if (iVar45 <= iVar44) {
                    iVar44 = iVar53;
                  }
                  if (iVar44 < 0) {
                    iVar44 = iVar45 + -1;
                  }
                  uVar62 = *(ushort *)(lVar12 + (long)iVar44 * 2);
                  if (puVar13 != (uint16_t *)0x0) {
                    uVar62 = puVar13[uVar62];
                  }
                  uVar43 = (uVar62 & 0x7fff) << 0xd;
                  uVar48 = (int)(short)uVar62 & 0x80000000;
                  if (uVar43 < 0x800000) {
                    if ((uVar62 & 0x7fff) != 0) {
                      uVar50 = 0x1f;
                      if ((uVar62 & 0x7fff) != 0) {
                        for (; uVar43 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                        }
                      }
                      iVar44 = (uVar50 ^ 0x1f) - 8;
                      uVar48 = (uVar48 | uVar43 << ((byte)iVar44 & 0x1f) | 0x38800000) +
                               iVar44 * -0x800000;
                    }
                  }
                  else if (uVar43 < 0xf800000) {
                    uVar48 = (uVar48 | uVar43) + 0x38000000;
                  }
                  else {
                    uVar48 = uVar48 | uVar43 | 0x7f800000;
                  }
                  *(uint *)(lVar52 + lVar56 * 4) = uVar48;
                  lVar56 = lVar56 + 1;
                  iVar53 = iVar53 + -1;
                } while (lVar56 != 8);
                lVar58 = lVar58 + 1;
                lVar52 = lVar52 + 0x20;
              } while (lVar58 != 8);
              lVar39 = lVar39 + 1;
            } while (lVar39 != lVar60);
            if (iVar11 == 3) {
              lVar39 = 0;
              do {
                fVar64 = *(float *)(local_148 + lVar39 * 4);
                fVar65 = *(float *)(local_100 + lVar39 * 4);
                fVar66 = *(float *)(local_108 + lVar39 * 4);
                *(float *)(local_148 + lVar39 * 4) =
                     fVar66 * 0.0722 + fVar64 * 0.2126 + fVar65 * 0.7152;
                *(float *)(local_100 + lVar39 * 4) =
                     fVar66 * 0.5 + fVar64 * -0.1146 + fVar65 * -0.3854;
                *(float *)(local_108 + lVar39 * 4) =
                     fVar66 * -0.0458 + fVar64 * 0.5 + fVar65 * -0.4542;
                lVar39 = lVar39 + 1;
              } while (lVar39 != 0x40);
            }
            if (0 < iVar11) {
              lVar39 = 0;
              local_138 = local_118;
              local_140 = local_110;
              do {
                local_c8 = lVar39;
                puVar14 = (undefined4 *)local_168[lVar39];
                bVar32 = true;
                do {
                  bVar33 = bVar32;
                  lVar39 = 0;
                  bVar32 = true;
                  do {
                    bVar42 = bVar32;
                    pfVar5 = (float *)(puVar14 + lVar39 * 4 + 0x38);
                    pfVar1 = (float *)(puVar14 + lVar39 * 4);
                    pfVar2 = (float *)(puVar14 + lVar39 * 4 + 8);
                    pfVar3 = (float *)(puVar14 + lVar39 * 4 + 0x10);
                    pfVar4 = (float *)(puVar14 + lVar39 * 4 + 0x18);
                    fVar84 = *pfVar1 + *pfVar5;
                    fVar85 = pfVar1[1] + pfVar5[1];
                    fVar86 = pfVar1[2] + pfVar5[2];
                    fVar87 = pfVar1[3] + pfVar5[3];
                    fVar64 = *pfVar2 + *pfVar3;
                    fVar65 = pfVar2[1] + pfVar3[1];
                    fVar66 = pfVar2[2] + pfVar3[2];
                    fVar67 = pfVar2[3] + pfVar3[3];
                    pfVar6 = (float *)(puVar14 + lVar39 * 4 + 0x20);
                    fVar92 = *pfVar4 + *pfVar6;
                    fVar93 = pfVar4[1] + pfVar6[1];
                    fVar94 = pfVar4[2] + pfVar6[2];
                    fVar95 = pfVar4[3] + pfVar6[3];
                    pfVar7 = (float *)(puVar14 + lVar39 * 4 + 0x28);
                    pfVar8 = (float *)(puVar14 + lVar39 * 4 + 0x30);
                    fVar72 = *pfVar1 - *pfVar5;
                    fVar73 = pfVar1[1] - pfVar5[1];
                    fVar74 = pfVar1[2] - pfVar5[2];
                    fVar75 = pfVar1[3] - pfVar5[3];
                    fVar88 = *pfVar7 + *pfVar8;
                    fVar89 = pfVar7[1] + pfVar8[1];
                    fVar90 = pfVar7[2] + pfVar8[2];
                    fVar91 = pfVar7[3] + pfVar8[3];
                    fVar80 = *pfVar2 - *pfVar3;
                    fVar81 = pfVar2[1] - pfVar3[1];
                    fVar82 = pfVar2[2] - pfVar3[2];
                    fVar83 = pfVar2[3] - pfVar3[3];
                    fVar76 = *pfVar4 - *pfVar6;
                    fVar77 = pfVar4[1] - pfVar6[1];
                    fVar78 = pfVar4[2] - pfVar6[2];
                    fVar79 = pfVar4[3] - pfVar6[3];
                    fVar68 = *pfVar7 - *pfVar8;
                    fVar69 = pfVar7[1] - pfVar8[1];
                    fVar70 = pfVar7[2] - pfVar8[2];
                    fVar71 = pfVar7[3] - pfVar8[3];
                    fVar96 = (fVar84 + fVar92) * 0.70710677;
                    fVar97 = (fVar85 + fVar93) * 0.70710677;
                    fVar98 = (fVar86 + fVar94) * 0.70710677;
                    fVar99 = (fVar87 + fVar95) * 0.70710677;
                    fVar100 = (fVar64 + fVar88) * 0.70710677;
                    fVar101 = (fVar65 + fVar89) * 0.70710677;
                    fVar102 = (fVar66 + fVar90) * 0.70710677;
                    fVar103 = (fVar67 + fVar91) * 0.70710677;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4);
                    *pfVar1 = (fVar96 + fVar100) * 0.5;
                    pfVar1[1] = (fVar97 + fVar101) * 0.5;
                    pfVar1[2] = (fVar98 + fVar102) * 0.5;
                    pfVar1[3] = (fVar99 + fVar103) * 0.5;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 0x20);
                    *pfVar1 = (fVar96 - fVar100) * 0.5;
                    pfVar1[1] = (fVar97 - fVar101) * 0.5;
                    pfVar1[2] = (fVar98 - fVar102) * 0.5;
                    pfVar1[3] = (fVar99 - fVar103) * 0.5;
                    fVar96 = fVar80 - fVar68;
                    fVar97 = fVar81 - fVar69;
                    fVar98 = fVar82 - fVar70;
                    fVar99 = fVar83 - fVar71;
                    fVar84 = fVar84 - fVar92;
                    fVar85 = fVar85 - fVar93;
                    fVar86 = fVar86 - fVar94;
                    fVar87 = fVar87 - fVar95;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 0x10);
                    *pfVar1 = fVar84 * 0.46193978 + fVar96 * 0.19134171;
                    pfVar1[1] = fVar85 * 0.46193978 + fVar97 * 0.19134171;
                    pfVar1[2] = fVar86 * 0.46193978 + fVar98 * 0.19134171;
                    pfVar1[3] = fVar87 * 0.46193978 + fVar99 * 0.19134171;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 0x30);
                    *pfVar1 = fVar84 * 0.19134171 - fVar96 * 0.46193978;
                    pfVar1[1] = fVar85 * 0.19134171 - fVar97 * 0.46193978;
                    pfVar1[2] = fVar86 * 0.19134171 - fVar98 * 0.46193978;
                    pfVar1[3] = fVar87 * 0.19134171 - fVar99 * 0.46193978;
                    fVar64 = (fVar64 - fVar88) * 0.70710677;
                    fVar65 = (fVar65 - fVar89) * 0.70710677;
                    fVar66 = (fVar66 - fVar90) * 0.70710677;
                    fVar67 = (fVar67 - fVar91) * 0.70710677;
                    fVar68 = (fVar68 + fVar80) * -0.70710677;
                    fVar69 = (fVar69 + fVar81) * -0.70710677;
                    fVar70 = (fVar70 + fVar82) * -0.70710677;
                    fVar71 = (fVar71 + fVar83) * -0.70710677;
                    fVar80 = fVar72 - fVar64;
                    fVar81 = fVar73 - fVar65;
                    fVar82 = fVar74 - fVar66;
                    fVar83 = fVar75 - fVar67;
                    fVar84 = fVar76 + fVar68;
                    fVar85 = fVar77 + fVar69;
                    fVar86 = fVar78 + fVar70;
                    fVar87 = fVar79 + fVar71;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 0x18);
                    *pfVar1 = fVar80 * 0.4157348 - fVar84 * 0.27778512;
                    pfVar1[1] = fVar81 * 0.4157348 - fVar85 * 0.27778512;
                    pfVar1[2] = fVar82 * 0.4157348 - fVar86 * 0.27778512;
                    pfVar1[3] = fVar83 * 0.4157348 - fVar87 * 0.27778512;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 0x28);
                    *pfVar1 = fVar84 * 0.4157348 + fVar80 * 0.27778512;
                    pfVar1[1] = fVar85 * 0.4157348 + fVar81 * 0.27778512;
                    pfVar1[2] = fVar86 * 0.4157348 + fVar82 * 0.27778512;
                    pfVar1[3] = fVar87 * 0.4157348 + fVar83 * 0.27778512;
                    fVar64 = fVar64 + fVar72;
                    fVar65 = fVar65 + fVar73;
                    fVar66 = fVar66 + fVar74;
                    fVar67 = fVar67 + fVar75;
                    fVar68 = fVar68 - fVar76;
                    fVar69 = fVar69 - fVar77;
                    fVar70 = fVar70 - fVar78;
                    fVar71 = fVar71 - fVar79;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 8);
                    *pfVar1 = fVar64 * 0.49039263 - fVar68 * 0.09754516;
                    pfVar1[1] = fVar65 * 0.49039263 - fVar69 * 0.09754516;
                    pfVar1[2] = fVar66 * 0.49039263 - fVar70 * 0.09754516;
                    pfVar1[3] = fVar67 * 0.49039263 - fVar71 * 0.09754516;
                    pfVar1 = (float *)(puVar14 + lVar39 * 4 + 0x38);
                    *pfVar1 = fVar68 * 0.49039263 + fVar64 * 0.09754516;
                    pfVar1[1] = fVar69 * 0.49039263 + fVar65 * 0.09754516;
                    pfVar1[2] = fVar70 * 0.49039263 + fVar66 * 0.09754516;
                    pfVar1[3] = fVar71 * 0.49039263 + fVar67 * 0.09754516;
                    lVar39 = 1;
                    bVar32 = false;
                  } while (bVar42);
                  uVar16 = puVar14[1];
                  uVar17 = puVar14[2];
                  uVar18 = puVar14[3];
                  uVar19 = puVar14[0xb];
                  uVar20 = puVar14[0x11];
                  uVar21 = puVar14[0x13];
                  uVar22 = puVar14[0x25];
                  uVar23 = puVar14[0x26];
                  uVar24 = puVar14[0x27];
                  uVar25 = puVar14[0x2f];
                  uVar26 = puVar14[0x35];
                  uVar27 = puVar14[0x37];
                  *puVar14 = *puVar14;
                  puVar14[1] = puVar14[8];
                  puVar14[2] = puVar14[0x10];
                  puVar14[3] = puVar14[0x18];
                  puVar14[0x10] = uVar17;
                  puVar14[0x11] = puVar14[10];
                  puVar14[0x12] = puVar14[0x12];
                  puVar14[0x13] = puVar14[0x1a];
                  puVar14[8] = uVar16;
                  puVar14[9] = puVar14[9];
                  puVar14[10] = uVar20;
                  puVar14[0xb] = puVar14[0x19];
                  puVar14[0x18] = uVar18;
                  puVar14[0x19] = uVar19;
                  puVar14[0x1a] = uVar21;
                  puVar14[0x1b] = puVar14[0x1b];
                  puVar14[0x24] = puVar14[0x24];
                  puVar14[0x25] = puVar14[0x2c];
                  puVar14[0x26] = puVar14[0x34];
                  puVar14[0x27] = puVar14[0x3c];
                  puVar14[0x34] = uVar23;
                  puVar14[0x35] = puVar14[0x2e];
                  puVar14[0x36] = puVar14[0x36];
                  puVar14[0x37] = puVar14[0x3e];
                  puVar14[0x2c] = uVar22;
                  puVar14[0x2d] = puVar14[0x2d];
                  puVar14[0x2e] = uVar26;
                  puVar14[0x2f] = puVar14[0x3d];
                  puVar14[0x3c] = uVar24;
                  puVar14[0x3d] = uVar25;
                  puVar14[0x3e] = uVar27;
                  puVar14[0x3f] = puVar14[0x3f];
                  uVar16 = puVar14[0x20];
                  uVar17 = puVar14[0x21];
                  uVar18 = puVar14[0x22];
                  uVar19 = puVar14[0x23];
                  uVar20 = puVar14[0x28];
                  uVar21 = puVar14[0x29];
                  uVar22 = puVar14[0x2a];
                  uVar23 = puVar14[0x2b];
                  uVar24 = puVar14[0x30];
                  uVar25 = puVar14[0x31];
                  uVar26 = puVar14[0x32];
                  uVar27 = puVar14[0x33];
                  uVar28 = puVar14[0x38];
                  uVar29 = puVar14[0x39];
                  uVar30 = puVar14[0x3a];
                  uVar31 = puVar14[0x3b];
                  puVar14[0x20] = puVar14[4];
                  puVar14[0x21] = puVar14[0xc];
                  puVar14[0x22] = puVar14[0x14];
                  puVar14[0x23] = puVar14[0x1c];
                  puVar14[0x30] = puVar14[6];
                  puVar14[0x31] = puVar14[0xe];
                  puVar14[0x32] = puVar14[0x16];
                  puVar14[0x33] = puVar14[0x1e];
                  puVar14[0x28] = puVar14[5];
                  puVar14[0x29] = puVar14[0xd];
                  puVar14[0x2a] = puVar14[0x15];
                  puVar14[0x2b] = puVar14[0x1d];
                  puVar14[0x38] = puVar14[7];
                  puVar14[0x39] = puVar14[0xf];
                  puVar14[0x3a] = puVar14[0x17];
                  puVar14[0x3b] = puVar14[0x1f];
                  puVar14[4] = uVar16;
                  puVar14[5] = uVar20;
                  puVar14[6] = uVar24;
                  puVar14[7] = uVar28;
                  puVar14[0x14] = uVar18;
                  puVar14[0x15] = uVar22;
                  puVar14[0x16] = uVar26;
                  puVar14[0x17] = uVar30;
                  puVar14[0xc] = uVar17;
                  puVar14[0xd] = uVar21;
                  puVar14[0xe] = uVar25;
                  puVar14[0xf] = uVar29;
                  puVar14[0x1c] = uVar19;
                  puVar14[0x1d] = uVar23;
                  puVar14[0x1e] = uVar27;
                  puVar14[0x1f] = uVar31;
                  bVar32 = false;
                } while (bVar33);
                uVar61 = 0xfffffffffffffffc;
                do {
                  uVar48 = puVar14[uVar61 + 4];
                  uVar50 = uVar48 & 0x7fffffff;
                  uVar43 = uVar48 >> 0x10 & 0x8000;
                  if (uVar50 < 0x38800000) {
                    if ((0x33000000 < uVar50) &&
                       (uVar48 = uVar48 & 0x7fffff | 0x800000, cVar15 = (char)(uVar50 >> 0x17),
                       uVar43 = uVar43 | uVar48 >> (0x7eU - cVar15 & 0x1f),
                       0x80000000 < uVar48 << (cVar15 + 0xa2U & 0x1f))) {
                      uVar43 = uVar43 + 1;
                    }
                  }
                  else if (uVar50 < 0x7f800000) {
                    if (uVar50 < 0x477ff000) {
                      uVar43 = uVar50 + 0x8000fff + (uint)((uVar50 >> 0xd & 1) != 0) >> 0xd | uVar43
                      ;
                    }
                    else {
                      uVar43 = uVar43 | 0x7c00;
                    }
                  }
                  else {
                    uVar43 = uVar43 | 0x7c00;
                    if (uVar50 != 0x7f800000) {
                      uVar48 = uVar50 >> 0xd & 0x3ff;
                      uVar43 = uVar43 | uVar48 | (uint)(uVar48 == 0);
                    }
                  }
                  uVar48 = puVar14[uVar61 + 5];
                  uVar50 = uVar48 & 0x7fffffff;
                  uVar57 = uVar48 >> 0x10 & 0x8000;
                  if (uVar50 < 0x38800000) {
                    if ((0x33000000 < uVar50) &&
                       (uVar48 = uVar48 & 0x7fffff | 0x800000, cVar15 = (char)(uVar50 >> 0x17),
                       uVar57 = uVar57 | uVar48 >> (0x7eU - cVar15 & 0x1f),
                       0x80000000 < uVar48 << (cVar15 + 0xa2U & 0x1f))) {
                      uVar57 = uVar57 + 1;
                    }
                  }
                  else if (uVar50 < 0x7f800000) {
                    if (uVar50 < 0x477ff000) {
                      uVar57 = uVar50 + 0x8000fff + (uint)((uVar50 >> 0xd & 1) != 0) >> 0xd | uVar57
                      ;
                    }
                    else {
                      uVar57 = uVar57 | 0x7c00;
                    }
                  }
                  else {
                    uVar57 = uVar57 | 0x7c00;
                    if (uVar50 != 0x7f800000) {
                      uVar48 = uVar50 >> 0xd & 0x3ff;
                      uVar57 = uVar57 | uVar48 | (uint)(uVar48 == 0);
                    }
                  }
                  uVar48 = puVar14[uVar61 + 6];
                  uVar50 = uVar48 & 0x7fffffff;
                  uVar59 = uVar48 >> 0x10 & 0x8000;
                  if (uVar50 < 0x38800000) {
                    if ((0x33000000 < uVar50) &&
                       (uVar48 = uVar48 & 0x7fffff | 0x800000, cVar15 = (char)(uVar50 >> 0x17),
                       uVar59 = uVar59 | uVar48 >> (0x7eU - cVar15 & 0x1f),
                       0x80000000 < uVar48 << (cVar15 + 0xa2U & 0x1f))) {
                      uVar59 = uVar59 + 1;
                    }
                  }
                  else if (uVar50 < 0x7f800000) {
                    if (uVar50 < 0x477ff000) {
                      uVar59 = uVar50 + 0x8000fff + (uint)((uVar50 >> 0xd & 1) != 0) >> 0xd | uVar59
                      ;
                    }
                    else {
                      uVar59 = uVar59 | 0x7c00;
                    }
                  }
                  else {
                    uVar59 = uVar59 | 0x7c00;
                    if (uVar50 != 0x7f800000) {
                      uVar48 = uVar50 >> 0xd & 0x3ff;
                      uVar59 = uVar59 | uVar48 | (uint)(uVar48 == 0);
                    }
                  }
                  uVar48 = puVar14[uVar61 + 7];
                  uVar50 = uVar48 & 0x7fffffff;
                  uVar51 = uVar48 >> 0x10 & 0x8000;
                  if (uVar50 < 0x38800000) {
                    if ((0x33000000 < uVar50) &&
                       (uVar48 = uVar48 & 0x7fffff | 0x800000, cVar15 = (char)(uVar50 >> 0x17),
                       uVar51 = uVar51 | uVar48 >> (0x7eU - cVar15 & 0x1f),
                       0x80000000 < uVar48 << (cVar15 + 0xa2U & 0x1f))) {
                      uVar51 = uVar51 + 1;
                    }
                  }
                  else if (uVar50 < 0x7f800000) {
                    if (uVar50 < 0x477ff000) {
                      uVar51 = uVar50 + 0x8000fff + (uint)((uVar50 >> 0xd & 1) != 0) >> 0xd | uVar51
                      ;
                    }
                    else {
                      uVar51 = uVar51 | 0x7c00;
                    }
                  }
                  else {
                    uVar51 = uVar51 | 0x7c00;
                    if (uVar50 != 0x7f800000) {
                      uVar48 = uVar50 >> 0xd & 0x3ff;
                      uVar51 = uVar51 | uVar48 | (uint)(uVar48 == 0);
                    }
                  }
                  fVar64 = local_140[uVar61 + 5];
                  fVar65 = local_140[uVar61 + 6];
                  fVar66 = local_140[uVar61 + 7];
                  uVar62 = local_138[uVar61 + 5];
                  uVar9 = local_138[uVar61 + 6];
                  uVar10 = local_138[uVar61 + 7];
                  uVar48 = (uVar43 & 0x7fff) << 0xd;
                  fVar67 = (float)((int)(short)uVar43 & 0x80000000);
                  if (uVar48 < 0x800000) {
                    if ((uVar43 & 0x7fff) != 0) {
                      uVar50 = 0x1f;
                      if ((uVar43 & 0x7fff) != 0) {
                        for (; uVar48 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                        }
                      }
                      iVar45 = (uVar50 ^ 0x1f) - 8;
                      fVar67 = (float)(((uint)fVar67 | uVar48 << ((byte)iVar45 & 0x1f) | 0x38800000)
                                      + iVar45 * -0x800000);
                    }
                  }
                  else if (uVar48 < 0xf800000) {
                    fVar67 = (float)(((uint)fVar67 | uVar48) + 0x38000000);
                  }
                  else {
                    fVar67 = (float)((uint)fVar67 | uVar48 | 0x7f800000);
                  }
                  uVar34 = algoQuantize(uVar43 & 0xffff,(uint)local_138[uVar61 + 4],
                                        local_140[uVar61 + 4],fVar67);
                  uVar48 = (uVar57 & 0x7fff) << 0xd;
                  fVar67 = (float)((int)(short)uVar57 & 0x80000000);
                  if (uVar48 < 0x800000) {
                    if ((uVar57 & 0x7fff) != 0) {
                      uVar43 = 0x1f;
                      if ((uVar57 & 0x7fff) != 0) {
                        for (; uVar48 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                        }
                      }
                      iVar45 = (uVar43 ^ 0x1f) - 8;
                      fVar67 = (float)(((uint)fVar67 | uVar48 << ((byte)iVar45 & 0x1f) | 0x38800000)
                                      + iVar45 * -0x800000);
                    }
                  }
                  else if (uVar48 < 0xf800000) {
                    fVar67 = (float)(((uint)fVar67 | uVar48) + 0x38000000);
                  }
                  else {
                    fVar67 = (float)((uint)fVar67 | uVar48 | 0x7f800000);
                  }
                  uVar35 = algoQuantize(uVar57 & 0xffff,(uint)uVar62,fVar64,fVar67);
                  uVar48 = (uVar59 & 0x7fff) << 0xd;
                  fVar64 = (float)((int)(short)uVar59 & 0x80000000);
                  if (uVar48 < 0x800000) {
                    if ((uVar59 & 0x7fff) != 0) {
                      uVar43 = 0x1f;
                      if ((uVar59 & 0x7fff) != 0) {
                        for (; uVar48 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                        }
                      }
                      iVar45 = (uVar43 ^ 0x1f) - 8;
                      fVar64 = (float)(((uint)fVar64 | uVar48 << ((byte)iVar45 & 0x1f) | 0x38800000)
                                      + iVar45 * -0x800000);
                    }
                  }
                  else if (uVar48 < 0xf800000) {
                    fVar64 = (float)(((uint)fVar64 | uVar48) + 0x38000000);
                  }
                  else {
                    fVar64 = (float)((uint)fVar64 | uVar48 | 0x7f800000);
                  }
                  uVar36 = algoQuantize(uVar59 & 0xffff,(uint)uVar9,fVar65,fVar64);
                  uVar48 = (uVar51 & 0x7fff) << 0xd;
                  fVar64 = (float)((int)(short)uVar51 & 0x80000000);
                  if (uVar48 < 0x800000) {
                    if ((uVar51 & 0x7fff) != 0) {
                      uVar43 = 0x1f;
                      if ((uVar51 & 0x7fff) != 0) {
                        for (; uVar48 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                        }
                      }
                      iVar45 = (uVar43 ^ 0x1f) - 8;
                      fVar64 = (float)(((uint)fVar64 | uVar48 << ((byte)iVar45 & 0x1f) | 0x38800000)
                                      + iVar45 * -0x800000);
                    }
                  }
                  else if (uVar48 < 0xf800000) {
                    fVar64 = (float)(((uint)fVar64 | uVar48) + 0x38000000);
                  }
                  else {
                    fVar64 = (float)((uint)fVar64 | uVar48 | 0x7f800000);
                  }
                  uVar37 = algoQuantize(uVar51 & 0xffff,(uint)uVar10,fVar66,fVar64);
                  local_b8[*(int *)(&UNK_00195890 + uVar61 * 4)] = uVar34;
                  local_b8[*(int *)(&UNK_00195894 + uVar61 * 4)] = uVar35;
                  local_b8[*(int *)(&UNK_00195898 + uVar61 * 4)] = uVar36;
                  local_b8[*(int *)(&UNK_0019589c + uVar61 * 4)] = uVar37;
                  uVar61 = uVar61 + 4;
                } while (uVar61 < 0x3c);
                puVar13 = *(uint16_t **)(puVar14 + 0x60);
                *(uint16_t **)(puVar14 + 0x60) = puVar13 + 1;
                *puVar13 = local_b8[0];
                e->_numDcComp = e->_numDcComp + 1;
                uVar41 = e->_numAcComp;
                uVar48 = 1;
                do {
                  uVar34 = local_b8[uVar48];
                  uVar43 = 1;
                  if (uVar34 == 0) {
                    if (uVar48 < 0x3f) {
                      uVar43 = uVar48 + 1;
                      uVar62 = 1;
                      do {
                        if (local_b8[uVar43] != 0) break;
                        uVar62 = uVar62 + 1;
                        uVar43 = uVar62 + uVar48;
                      } while (uVar43 < 0x40);
                      if (uVar62 == 1) {
                        uVar34 = 0;
                        uVar43 = 1;
                      }
                      else {
                        uVar34 = uVar62 | 0xff00;
                        if (uVar43 == 0x40) {
                          uVar34 = 0xff00;
                        }
                        uVar43 = (uint)uVar62;
                      }
                    }
                    else {
                      uVar34 = 0;
                    }
                  }
                  *puVar54 = uVar34;
                  uVar41 = uVar41 + 1;
                  uVar48 = uVar48 + uVar43;
                  puVar54 = puVar54 + 1;
                } while (uVar48 < 0x40);
                *local_d0 = uVar41;
                lVar39 = local_c8 + 1;
                local_138 = local_e0;
                local_140 = local_d8;
              } while (lVar39 != lVar60);
            }
          }
          uVar61 = local_f0 + 1;
          iVar63 = iVar63 + 8;
          uVar47 = (ulong)((int)local_e8 - 8);
        } while (uVar61 != local_f8);
      }
      uVar61 = local_120 + 1;
    } while (uVar61 != local_128);
  }
  if (local_150 != (void *)0x0) {
    (*local_130)(local_150);
  }
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (
    void* (*alloc_fn) (size_t), void (*free_fn) (void*), LossyDctEncoder* e)
{
    int                  numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) (ceilf ((float) e->_width / 8.0f));
    int numBlocksY = (int) (ceilf ((float) e->_height / 8.0f));

    uint16_t halfZigCoef[64];

    uint16_t* currAcComp            = (uint16_t*) e->_packedAc;
    int       tmpHalfBufferElements = 0;
    uint16_t* tmpHalfBuffer         = NULL;
    uint16_t* tmpHalfBufferPtr      = NULL;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) alloc_fn (
            (size_t) tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (int chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t              h;
            const float* restrict quantTable;
            const uint16_t* restrict hquantTable;

            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            quantTable = e->_quantTableY;
            hquantTable = e->_hquantTableY;
            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, zigzag, and convert to XDR
                //
                quantizeCoeffAndZigXDR (halfZigCoef, chanData[chan]->_dctData,
                                        quantTable, hquantTable);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
                hquantTable = e->_hquantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) free_fn (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}